

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> *
wallet::InterpretSubtractFeeFromOutputInstructions
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          UniValue *sffo_instructions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *destinations)

{
  _Rb_tree_header *p_Var1;
  pointer pUVar2;
  bool bVar3;
  __type_conflict1 _Var4;
  VType VVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  string *__lhs;
  const_reference __rhs;
  UniValue *pUVar7;
  size_t i;
  ulong __n;
  pointer this;
  long in_FS_OFFSET;
  int pos;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (sffo_instructions->typ != VNULL) {
    if (sffo_instructions->typ == VBOOL) {
      bVar3 = UniValue::get_bool(sffo_instructions);
      if (bVar3) {
        local_58._M_dataplus._M_p._0_4_ = 0;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&__return_storage_ptr__->_M_t,(int *)&local_58);
      }
    }
    else {
      pvVar6 = UniValue::getValues(sffo_instructions);
      pUVar2 = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (this = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_start; this != pUVar2; this = this + 1) {
        VVar5 = this->typ;
        if (VVar5 == VSTR) {
          for (__n = 0; __n < (ulong)((long)(destinations->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(destinations->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 5);
              __n = __n + 1) {
            __lhs = UniValue::get_str_abi_cxx11_(this);
            __rhs = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::at(destinations,__n);
            _Var4 = std::operator==(__lhs,__rhs);
            if (_Var4) {
              local_58._M_dataplus._M_p._0_4_ = (undefined4)__n;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>(&__return_storage_ptr__->_M_t,(int *)&local_58);
              break;
            }
          }
          VVar5 = this->typ;
        }
        if (VVar5 == VNUM) {
          pos = UniValue::getInt<int>(this);
          bVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::contains
                            (__return_storage_ptr__,&pos);
          if (bVar3) {
            pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(&local_58,"Invalid parameter, duplicated position: %d",&pos);
            JSONRPCError(pUVar7,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_0026cc3a;
          }
          if (pos < 0) {
            pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(&local_58,"Invalid parameter, negative position: %d",&pos);
            JSONRPCError(pUVar7,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_0026cc3a;
          }
          if ((int)((ulong)((long)(destinations->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(destinations->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 5) <= pos) {
            pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
            tinyformat::format<int>(&local_58,"Invalid parameter, position too large: %d",&pos);
            JSONRPCError(pUVar7,-8,&local_58);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_0026cc3a;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     __return_storage_ptr__,&pos);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0026cc3a:
  __stack_chk_fail();
}

Assistant:

std::set<int> InterpretSubtractFeeFromOutputInstructions(const UniValue& sffo_instructions, const std::vector<std::string>& destinations)
{
    std::set<int> sffo_set;
    if (sffo_instructions.isNull()) return sffo_set;
    if (sffo_instructions.isBool()) {
        if (sffo_instructions.get_bool()) sffo_set.insert(0);
        return sffo_set;
    }
    for (const auto& sffo : sffo_instructions.getValues()) {
        if (sffo.isStr()) {
            for (size_t i = 0; i < destinations.size(); ++i) {
                if (sffo.get_str() == destinations.at(i)) {
                    sffo_set.insert(i);
                    break;
                }
            }
        }
        if (sffo.isNum()) {
            int pos = sffo.getInt<int>();
            if (sffo_set.contains(pos))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, duplicated position: %d", pos));
            if (pos < 0)
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, negative position: %d", pos));
            if (pos >= int(destinations.size()))
                throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid parameter, position too large: %d", pos));
            sffo_set.insert(pos);
        }
    }
    return sffo_set;
}